

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yajl_parser.c
# Opt level: O0

longlong yajl_parse_integer(uchar *number,uint length)

{
  int *piVar1;
  uint in_ESI;
  byte *in_RDI;
  uchar *pos;
  long sign;
  longlong ret;
  byte *local_30;
  long local_28;
  long local_20;
  
  local_20 = 0;
  local_28 = 1;
  local_30 = in_RDI;
  if (*in_RDI == 0x2d) {
    local_30 = in_RDI + 1;
    local_28 = -1;
  }
  if (*local_30 == 0x2b) {
    local_30 = local_30 + 1;
  }
  while( true ) {
    if (in_RDI + in_ESI <= local_30) {
      return local_28 * local_20;
    }
    if (0xcccccccccccccd3 < local_20) {
      piVar1 = __errno_location();
      *piVar1 = 0x22;
      if (local_28 != 1) {
        return -0x8000000000000000;
      }
      return 0x7fffffffffffffff;
    }
    if (local_20 * -10 + 0x7fffffffffffffff < (long)(int)(*local_30 - 0x30)) {
      piVar1 = __errno_location();
      *piVar1 = 0x22;
      if (local_28 != 1) {
        return -0x8000000000000000;
      }
      return 0x7fffffffffffffff;
    }
    if ((*local_30 < 0x30) || (0x39 < *local_30)) break;
    local_20 = (long)(int)(*local_30 - 0x30) + local_20 * 10;
    local_30 = local_30 + 1;
  }
  piVar1 = __errno_location();
  *piVar1 = 0x22;
  if (local_28 != 1) {
    return -0x8000000000000000;
  }
  return 0x7fffffffffffffff;
}

Assistant:

long long
yajl_parse_integer(const unsigned char *number, unsigned int length)
{
    long long ret  = 0;
    long sign = 1;
    const unsigned char *pos = number;
    if (*pos == '-') { pos++; sign = -1; }
    if (*pos == '+') { pos++; }

    while (pos < number + length) {
        if ( ret > MAX_VALUE_TO_MULTIPLY ) {
            errno = ERANGE;
            return sign == 1 ? LLONG_MAX : LLONG_MIN;
        }
        ret *= 10;
        if (LLONG_MAX - ret < (*pos - '0')) {
            errno = ERANGE;
            return sign == 1 ? LLONG_MAX : LLONG_MIN;
        }
        if (*pos < '0' || *pos > '9') {
            errno = ERANGE;
            return sign == 1 ? LLONG_MAX : LLONG_MIN;
        }
        ret += (*pos++ - '0');
    }

    return sign * ret;
}